

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O2

void dlib::cpu::batch_normalize_conv_inference
               (double eps,resizable_tensor *dest,tensor *src,tensor *gamma,tensor *beta,
               tensor *running_means,tensor *running_variances)

{
  uint *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ostream *poVar7;
  fatal_error *this;
  long lVar8;
  long lVar9;
  long lVar10;
  long k;
  long lVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  long local_1e8;
  string local_1c8;
  ostringstream dlib_o_out;
  uint auStack_190 [88];
  
  if (((((gamma->m_n == 1) && (gamma->m_nr == 1)) && (gamma->m_nc == 1)) &&
      ((gamma->m_k == src->m_k && (bVar2 = have_same_dimensions(gamma,beta), bVar2)))) &&
     ((bVar2 = have_same_dimensions(gamma,running_means), bVar2 &&
      ((bVar2 = have_same_dimensions(gamma,running_variances), 0.0 < eps && (bVar2)))))) {
    resizable_tensor::copy_size(dest,src);
    iVar3 = (*(dest->super_tensor)._vptr_tensor[3])(dest);
    local_1e8 = CONCAT44(extraout_var,iVar3);
    iVar3 = (*src->_vptr_tensor[2])(src);
    lVar13 = CONCAT44(extraout_var_00,iVar3);
    iVar3 = (*gamma->_vptr_tensor[2])(gamma);
    iVar4 = (*beta->_vptr_tensor[2])(beta);
    iVar5 = (*running_means->_vptr_tensor[2])(running_means);
    iVar6 = (*running_variances->_vptr_tensor[2])();
    lVar10 = src->m_nc * src->m_nr;
    lVar9 = 0;
    if (lVar10 < 1) {
      lVar10 = lVar9;
    }
    for (; lVar9 < src->m_n; lVar9 = lVar9 + 1) {
      for (lVar11 = 0; lVar11 < src->m_k; lVar11 = lVar11 + 1) {
        dVar14 = (double)*(float *)(CONCAT44(extraout_var_04,iVar6) + lVar11 * 4) + eps;
        if (dVar14 < 0.0) {
          dVar14 = sqrt(dVar14);
        }
        else {
          dVar14 = SQRT(dVar14);
        }
        lVar12 = 0;
        for (lVar8 = 0; lVar10 != lVar8; lVar8 = lVar8 + 1) {
          *(float *)(local_1e8 + lVar8 * 4) =
               (*(float *)(lVar13 + lVar8 * 4) -
               *(float *)(CONCAT44(extraout_var_03,iVar5) + lVar11 * 4)) *
               *(float *)(CONCAT44(extraout_var_01,iVar3) + lVar11 * 4) * (float)(1.0 / dVar14) +
               *(float *)(CONCAT44(extraout_var_02,iVar4) + lVar11 * 4);
          lVar12 = lVar12 + -4;
        }
        lVar13 = lVar13 - lVar12;
        local_1e8 = local_1e8 - lVar12;
      }
    }
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
  poVar7 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x3b3);
  std::operator<<(poVar7,".\n");
  poVar7 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
  poVar7 = std::operator<<(poVar7,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                          );
  std::operator<<(poVar7,".\n");
  poVar7 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
  poVar7 = std::operator<<(poVar7,
                           "void dlib::cpu::batch_normalize_conv_inference(const double, resizable_tensor &, const tensor &, const tensor &, const tensor &, const tensor &, const tensor &)"
                          );
  std::operator<<(poVar7,".\n\n");
  poVar7 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
  poVar7 = std::operator<<(poVar7,
                           "gamma.num_samples() == 1 && gamma.nr() == 1 && gamma.nc() == 1 && gamma.k() == src.k() && have_same_dimensions(gamma, beta) && have_same_dimensions(gamma, running_means) && have_same_dimensions(gamma, running_variances) && eps > 0"
                          );
  std::operator<<(poVar7,".\n");
  puVar1 = (uint *)((long)auStack_190 + *(long *)(_dlib_o_out + -0x18));
  *puVar1 = *puVar1 | 1;
  poVar7 = std::operator<<((ostream *)&dlib_o_out,"\ngamma.num_samples(): ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  poVar7 = std::operator<<(poVar7,"\ngamma.k():  ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  poVar7 = std::operator<<(poVar7,"\ngamma.nr(): ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  poVar7 = std::operator<<(poVar7,"\ngamma.nc(): ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  poVar7 = std::operator<<(poVar7,"\nbeta.num_samples(): ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  poVar7 = std::operator<<(poVar7,"\nbeta.k():   ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  poVar7 = std::operator<<(poVar7,"\nbeta.nr():  ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  poVar7 = std::operator<<(poVar7,"\nbeta.nc():  ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  poVar7 = std::operator<<(poVar7,"\nrunning_means.num_samples(): ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  poVar7 = std::operator<<(poVar7,"\nrunning_means.k():   ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  poVar7 = std::operator<<(poVar7,"\nrunning_means.nr():  ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  poVar7 = std::operator<<(poVar7,"\nrunning_means.nc():  ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  poVar7 = std::operator<<(poVar7,"\nrunning_variances.num_samples(): ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  poVar7 = std::operator<<(poVar7,"\nrunning_variances.k():   ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  poVar7 = std::operator<<(poVar7,"\nrunning_variances.nr():  ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  poVar7 = std::operator<<(poVar7,"\nrunning_variances.nc():  ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  poVar7 = std::operator<<(poVar7,"\nsrc.k():   ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  poVar7 = std::operator<<(poVar7,"\nsrc.nr():  ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  poVar7 = std::operator<<(poVar7,"\nsrc.nc():  ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  std::operator<<(poVar7,"\neps:  ");
  poVar7 = std::ostream::_M_insert<double>(eps);
  std::operator<<(poVar7,"\n");
  this = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this,EBROKEN_ASSERT,&local_1c8);
  __cxa_throw(this,&fatal_error::typeinfo,error::~error);
}

Assistant:

void batch_normalize_conv_inference (
            const double eps,
            resizable_tensor& dest,
            const tensor& src,
            const tensor& gamma, 
            const tensor& beta,
            const tensor& running_means,
            const tensor& running_variances
        )
        {
            DLIB_CASSERT(
                gamma.num_samples() == 1 && 
                gamma.nr() == 1 &&
                gamma.nc() == 1 &&
                gamma.k()  == src.k() &&
                have_same_dimensions(gamma, beta) &&
                have_same_dimensions(gamma, running_means) &&
                have_same_dimensions(gamma, running_variances) &&
                eps > 0, 
                "\ngamma.num_samples(): " << gamma.num_samples() << 
                "\ngamma.k():  " << gamma.k() << 
                "\ngamma.nr(): " << gamma.nr() << 
                "\ngamma.nc(): " << gamma.nc() << 
                "\nbeta.num_samples(): " << beta.num_samples() << 
                "\nbeta.k():   " << beta.k() << 
                "\nbeta.nr():  " << beta.nr() << 
                "\nbeta.nc():  " << beta.nc() << 
                "\nrunning_means.num_samples(): " << running_means.num_samples() << 
                "\nrunning_means.k():   " << running_means.k() << 
                "\nrunning_means.nr():  " << running_means.nr() << 
                "\nrunning_means.nc():  " << running_means.nc() << 
                "\nrunning_variances.num_samples(): " << running_variances.num_samples() << 
                "\nrunning_variances.k():   " << running_variances.k() << 
                "\nrunning_variances.nr():  " << running_variances.nr() << 
                "\nrunning_variances.nc():  " << running_variances.nc() << 
                "\nsrc.k():   " << src.k() << 
                "\nsrc.nr():  " << src.nr() << 
                "\nsrc.nc():  " << src.nc() <<
                "\neps:  " << eps 
            );
            dest.copy_size(src);

            auto d = dest.host();
            auto s = src.host();
            auto g = gamma.host();
            auto b = beta.host();
            auto m = running_means.host();
            auto v = running_variances.host();

            const long num = src.nr()*src.nc();
            for (long n = 0; n < src.num_samples(); ++n)
            {
                for (long k = 0; k < src.k(); ++k)
                {
                    const float invstd = 1.0f/std::sqrt(v[k] + eps);
                    for (long j = 0; j < num; ++j)
                    {
                        *d = g[k]*(*s - m[k])*invstd + b[k];
                        ++d;
                        ++s;
                    }
                }
            }
        }